

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesOptionsWidget.cxx
# Opt level: O1

void __thiscall cmCursesOptionsWidget::SetOption(cmCursesOptionsWidget *this,string *value)

{
  pointer pbVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  size_type sVar4;
  pointer pbVar5;
  
  this->CurrentOption = 0;
  (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[4])();
  pbVar5 = (this->Options).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->Options).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar1) {
    __s2 = (value->_M_dataplus)._M_p;
    sVar2 = value->_M_string_length;
    sVar4 = 0;
    do {
      __n = pbVar5->_M_string_length;
      if (__n == sVar2) {
        if (__n != 0) {
          iVar3 = bcmp((pbVar5->_M_dataplus)._M_p,__s2,__n);
          if (iVar3 != 0) goto LAB_0021e556;
        }
        this->CurrentOption = sVar4;
      }
LAB_0021e556:
      sVar4 = sVar4 + 1;
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar1);
  }
  return;
}

Assistant:

void cmCursesOptionsWidget::SetOption(const std::string& value)
{
  this->CurrentOption = 0; // default to 0 index
  this->SetValue(value);
  int index = 0;
  for(std::vector<std::string>::iterator i = this->Options.begin();
      i != this->Options.end(); ++i)
    {
    if(*i == value)
      {
      this->CurrentOption = index;
      }
    index++;
    }
}